

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  int iVar1;
  Table *pTVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int i;
  Table *p;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  int iVar4;
  Table *local_28;
  
  uVar3 = 0xaaaaaaaa;
  if (in_RDX == (char *)0x0) {
    pTVar2 = (Table *)sqlite3HashFind((Hash *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0),
                                      in_stack_ffffffffffffffc8);
    if (pTVar2 != (Table *)0x0) {
      return pTVar2;
    }
    pTVar2 = (Table *)sqlite3HashFind((Hash *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                                      in_stack_ffffffffffffffc8);
    if (pTVar2 != (Table *)0x0) {
      return pTVar2;
    }
    iVar4 = 2;
    local_28 = (Table *)0x0;
    while ((iVar4 < *(int *)(in_RDI + 0x28) &&
           (local_28 = (Table *)sqlite3HashFind((Hash *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                                                in_stack_ffffffffffffffc8), local_28 == (Table *)0x0
           ))) {
      iVar4 = iVar4 + 1;
    }
    if ((local_28 == (Table *)0x0) && (iVar1 = sqlite3_strnicmp(in_RSI,"sqlite_",7), iVar1 == 0)) {
      iVar1 = sqlite3StrICmp(in_RSI + 7,"schema");
      if (iVar1 == 0) {
        local_28 = (Table *)sqlite3HashFind((Hash *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                                            in_stack_ffffffffffffffc8);
      }
      else {
        iVar1 = sqlite3StrICmp(in_RSI + 7,"temp_schema");
        if (iVar1 == 0) {
          local_28 = (Table *)sqlite3HashFind((Hash *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                                              in_stack_ffffffffffffffc8);
        }
      }
    }
  }
  else {
    iVar4 = 0;
    while ((iVar4 < *(int *)(in_RDI + 0x28) &&
           (iVar1 = sqlite3StrICmp(in_RDX,*(char **)(*(long *)(in_RDI + 0x20) + (long)iVar4 * 0x20))
           , iVar1 != 0))) {
      iVar4 = iVar4 + 1;
    }
    if (*(int *)(in_RDI + 0x28) <= iVar4) {
      iVar4 = sqlite3StrICmp(in_RDX,"main");
      if (iVar4 != 0) {
        return (Table *)0x0;
      }
      iVar4 = 0;
    }
    local_28 = (Table *)sqlite3HashFind((Hash *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                                        in_stack_ffffffffffffffc8);
    if ((local_28 == (Table *)0x0) && (iVar1 = sqlite3_strnicmp(in_RSI,"sqlite_",7), iVar1 == 0)) {
      if (iVar4 == 1) {
        iVar1 = sqlite3StrICmp(in_RSI + 7,"temp_schema");
        if (((iVar1 == 0) || (iVar1 = sqlite3StrICmp(in_RSI + 7,"schema"), iVar1 == 0)) ||
           (iVar1 = sqlite3StrICmp(in_RSI + 7,"master"), iVar1 == 0)) {
          local_28 = (Table *)sqlite3HashFind((Hash *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                                              in_stack_ffffffffffffffc8);
        }
      }
      else {
        iVar1 = sqlite3StrICmp(in_RSI + 7,"schema");
        if (iVar1 == 0) {
          local_28 = (Table *)sqlite3HashFind((Hash *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                                              in_stack_ffffffffffffffc8);
        }
      }
    }
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  if( zDatabase ){
    for(i=0; i<db->nDb; i++){
      if( sqlite3StrICmp(zDatabase, db->aDb[i].zDbSName)==0 ) break;
    }
    if( i>=db->nDb ){
      /* No match against the official names.  But always match "main"
      ** to schema 0 as a legacy fallback. */
      if( sqlite3StrICmp(zDatabase,"main")==0 ){
        i = 0;
      }else{
        return 0;
      }
    }
    p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( i==1 ){
        if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &LEGACY_SCHEMA_TABLE[7])==0
        ){
          p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                              LEGACY_TEMP_SCHEMA_TABLE);
        }
      }else{
        if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
          p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash,
                              LEGACY_SCHEMA_TABLE);
        }
      }
    }
  }else{
    /* Match against TEMP first */
    p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash, zName);
    if( p ) return p;
    /* The main database is second */
    p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, zName);
    if( p ) return p;
    /* Attached databases are in order of attachment */
    for(i=2; i<db->nDb; i++){
      assert( sqlite3SchemaMutexHeld(db, i, 0) );
      p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
      if( p ) break;
    }
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, LEGACY_SCHEMA_TABLE);
      }else if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                            LEGACY_TEMP_SCHEMA_TABLE);
      }
    }
  }
  return p;
}